

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O1

void __thiscall
Diligent::DynamicLinearAllocator::DynamicLinearAllocator
          (DynamicLinearAllocator *this,IMemoryAllocator *Allocator,Uint32 BlockSize)

{
  char (*in_R8) [22];
  string msg;
  Uint32 local_34;
  string local_30;
  
  (this->m_Blocks).
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Blocks).
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Blocks).
  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_BlockSize = BlockSize;
  this->m_pAllocator = Allocator;
  if ((BlockSize ^ BlockSize - 1) <= BlockSize - 1) {
    local_34 = BlockSize;
    FormatString<char[13],unsigned_int,char[22]>
              (&local_30,(Diligent *)"Block size (",(char (*) [13])&local_34,
               (uint *)") is not power of two",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"DynamicLinearAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
               ,0x3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

explicit DynamicLinearAllocator(IMemoryAllocator& Allocator, Uint32 BlockSize = 4 << 10) :
        m_BlockSize{BlockSize},
        m_pAllocator{&Allocator}
    {
        VERIFY(IsPowerOfTwo(BlockSize), "Block size (", BlockSize, ") is not power of two");
    }